

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIFont * __thiscall irr::gui::CGUIEnvironment::getFont(CGUIEnvironment *this,path *filename)

{
  bool bVar1;
  s32 sVar2;
  uint uVar3;
  SFont *pSVar4;
  CGUIFont *this_00;
  undefined8 in_RSI;
  CGUIFont *in_RDI;
  double __x;
  CGUIFont *font;
  IGUIFont *ifont;
  s32 index;
  SFont f;
  undefined4 in_stack_ffffffffffffff68;
  u32 in_stack_ffffffffffffff6c;
  array<irr::gui::CGUIEnvironment::SFont> *in_stack_ffffffffffffff70;
  SFont *in_stack_ffffffffffffff78;
  CGUIFont *this_01;
  path *in_stack_ffffffffffffff88;
  SNamedPath *in_stack_ffffffffffffff90;
  CGUIFont *pCVar5;
  SNamedPath local_60;
  CGUIFont *local_20;
  undefined8 local_18;
  CGUIFont *local_8;
  
  local_18 = in_RSI;
  SFont::SFont((SFont *)0x3aeeee);
  irr::io::SNamedPath::setPath(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar2 = core::array<irr::gui::CGUIEnvironment::SFont>::binary_search
                    ((array<irr::gui::CGUIEnvironment::SFont> *)in_RDI,in_stack_ffffffffffffff78);
  if (sVar2 == -1) {
    uVar3 = (*(in_RDI[2].Driver)->_vptr_IVideoDriver[0x1b])(in_RDI[2].Driver,local_18);
    if ((uVar3 & 1) == 0) {
      irr::io::SNamedPath::getPath(&local_60);
      os::Printer::log(__x);
      local_8 = (CGUIFont *)0x0;
    }
    else {
      this_00 = (CGUIFont *)operator_new(0xb8);
      irr::io::SNamedPath::getPath(&local_60);
      CGUIFont::CGUIFont(in_RDI,(IGUIEnvironment *)in_stack_ffffffffffffff78,(path *)this_00);
      this_01 = this_00;
      pCVar5 = this_00;
      irr::io::SNamedPath::getPath(&local_60);
      bVar1 = CGUIFont::load(this_01,(path *)this_00);
      if (bVar1) {
        local_20 = pCVar5;
        core::array<irr::gui::CGUIEnvironment::SFont>::push_back
                  ((array<irr::gui::CGUIEnvironment::SFont> *)this_00,
                   (SFont *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_8 = pCVar5;
      }
      else {
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_8 = (CGUIFont *)0x0;
      }
    }
  }
  else {
    pSVar4 = core::array<irr::gui::CGUIEnvironment::SFont>::operator[]
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    local_8 = (CGUIFont *)pSVar4->Font;
  }
  SFont::~SFont((SFont *)0x3af088);
  return (IGUIFont *)local_8;
}

Assistant:

IGUIFont *CGUIEnvironment::getFont(const io::path &filename)
{
	// search existing font

	SFont f;
	f.NamedPath.setPath(filename);

	s32 index = Fonts.binary_search(f);
	if (index != -1)
		return Fonts[index].Font;

	// font doesn't exist, attempt to load it

	// does the file exist?

	if (!FileSystem->existFile(filename)) {
		os::Printer::log("Could not load font because the file does not exist", f.NamedPath.getPath(), ELL_ERROR);
		return 0;
	}

	IGUIFont *ifont = 0;
#if 0
		{
			CGUIFont* font = new CGUIFont(this, filename);
			ifont = (IGUIFont*)font;

			// load the font
			io::path directory;
			core::splitFilename(filename, &directory);
			if (!font->load(xml, directory))
			{
				font->drop();
				font  = 0;
				ifont = 0;
			}
		}
#endif

	if (!ifont) {

		CGUIFont *font = new CGUIFont(this, f.NamedPath.getPath());
		ifont = (IGUIFont *)font;
		if (!font->load(f.NamedPath.getPath())) {
			font->drop();
			return 0;
		}
	}

	// add to fonts.

	f.Font = ifont;
	Fonts.push_back(f);

	return ifont;
}